

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.h
# Opt level: O1

ostream * ser::operator<<(ostream *out,Savepoint *sp)

{
  ostream *poVar1;
  string local_30;
  
  Savepoint::ToString_abi_cxx11_(&local_30,sp);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, const Savepoint& sp)
    {
        return out << sp.ToString();
    }